

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O1

void __thiscall bwtil::cw_bwt::computeActualEntropy(cw_bwt *this)

{
  pointer puVar1;
  unsigned_long uVar2;
  undefined1 auVar3 [16];
  double *pdVar4;
  ulint uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [16];
  undefined1 in_XMM3 [16];
  
  this->bits_per_symbol = 0.0;
  if (this->number_of_contexts != 0) {
    auVar6 = ZEXT864((ulong)this->bits_per_symbol);
    puVar1 = (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    auVar7 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,this->n);
    auVar7._0_8_ = 1.0 / auVar7._0_8_;
    auVar7._8_8_ = 0x3ff0000000000000;
    pdVar4 = &((this->dynStrings).
               super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->H0;
    uVar5 = 0;
    do {
      uVar2 = puVar1[uVar5];
      if (uVar2 != 0) {
        auVar3 = vcvtusi2sd_avx512f(in_XMM3,uVar2);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = auVar3._0_8_ * *pdVar4;
        auVar3 = vfmadd231sd_fma(auVar6._0_16_,auVar7,auVar8);
        auVar6 = ZEXT1664(auVar3);
        this->bits_per_symbol = auVar3._0_8_;
      }
      uVar5 = uVar5 + 1;
      pdVar4 = pdVar4 + 0x11;
    } while (this->number_of_contexts != uVar5);
  }
  return;
}

Assistant:

void computeActualEntropy(){//actual entropy of order k obtained with the Huffman compressor. Always >= empiricalEntropy()

		//warning:to be called AFTER initialization of structures

		bits_per_symbol = 0;//k-order empirical entropy

		for(ulint i=0;i<number_of_contexts;i++){//for each non-empty context

			if(lengths[i]>0){

				double H0 = dynStrings[i].entropy();

				bits_per_symbol += H0*((double)lengths[i]/(double)n);

			}
		}

	}